

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int evsig_set_handler_(event_base *base,int evsignal,_func_void_int *handler)

{
  int iVar1;
  sigaction **ppsVar2;
  long lVar3;
  sigaction *psVar4;
  char *fmt;
  long lVar5;
  _union_1457 local_c8;
  sigset_t local_c0;
  undefined4 local_40;
  
  lVar5 = (long)evsignal;
  if ((base->sig).sh_old_max <= evsignal) {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: evsignal (%d) >= sh_old_max (%d), resizing","evsig_set_handler_",evsignal);
    }
    iVar1 = (int)(lVar5 + 1);
    ppsVar2 = (sigaction **)event_mm_realloc_((base->sig).sh_old,(long)iVar1 << 3);
    if (ppsVar2 == (sigaction **)0x0) {
      fmt = "realloc";
      goto LAB_001fe44d;
    }
    lVar3 = (long)(base->sig).sh_old_max;
    memset(ppsVar2 + lVar3,0,((lVar5 + 1) - lVar3) * 8);
    (base->sig).sh_old_max = iVar1;
    (base->sig).sh_old = ppsVar2;
  }
  psVar4 = (sigaction *)event_mm_malloc_(0x98);
  (base->sig).sh_old[lVar5] = psVar4;
  if ((base->sig).sh_old[lVar5] != (sigaction *)0x0) {
    memset(&local_c0,0,0x90);
    local_40 = 0x10000000;
    local_c8 = (_union_1457)handler;
    sigfillset(&local_c0);
    iVar1 = sigaction(evsignal,(sigaction *)&local_c8,(sigaction *)(base->sig).sh_old[lVar5]);
    if (iVar1 == -1) {
      event_warn("sigaction");
      event_mm_free_((base->sig).sh_old[lVar5]);
      (base->sig).sh_old[lVar5] = (sigaction *)0x0;
      return -1;
    }
    return 0;
  }
  fmt = "malloc";
LAB_001fe44d:
  event_warn(fmt);
  return -1;
}

Assistant:

int
evsig_set_handler_(struct event_base *base,
    int evsignal, void (__cdecl *handler)(int))
{
#ifdef EVENT__HAVE_SIGACTION
	struct sigaction sa;
#else
	ev_sighandler_t sh;
#endif
	struct evsig_info *sig = &base->sig;
	void *p;

	/*
	 * resize saved signal handler array up to the highest signal number.
	 * a dynamic array is used to keep footprint on the low side.
	 */
	if (evsignal >= sig->sh_old_max) {
		int new_max = evsignal + 1;
		event_debug(("%s: evsignal (%d) >= sh_old_max (%d), resizing",
			    __func__, evsignal, sig->sh_old_max));
		p = mm_realloc(sig->sh_old, new_max * sizeof(*sig->sh_old));
		if (p == NULL) {
			event_warn("realloc");
			return (-1);
		}

		memset((char *)p + sig->sh_old_max * sizeof(*sig->sh_old),
		    0, (new_max - sig->sh_old_max) * sizeof(*sig->sh_old));

		sig->sh_old_max = new_max;
		sig->sh_old = p;
	}

	/* allocate space for previous handler out of dynamic array */
	sig->sh_old[evsignal] = mm_malloc(sizeof *sig->sh_old[evsignal]);
	if (sig->sh_old[evsignal] == NULL) {
		event_warn("malloc");
		return (-1);
	}

	/* save previous handler and setup new handler */
#ifdef EVENT__HAVE_SIGACTION
	memset(&sa, 0, sizeof(sa));
	sa.sa_handler = handler;
	sa.sa_flags |= SA_RESTART;
	sigfillset(&sa.sa_mask);

	if (sigaction(evsignal, &sa, sig->sh_old[evsignal]) == -1) {
		event_warn("sigaction");
		mm_free(sig->sh_old[evsignal]);
		sig->sh_old[evsignal] = NULL;
		return (-1);
	}
#else
	if ((sh = signal(evsignal, handler)) == SIG_ERR) {
		event_warn("signal");
		mm_free(sig->sh_old[evsignal]);
		sig->sh_old[evsignal] = NULL;
		return (-1);
	}
	*sig->sh_old[evsignal] = sh;
#endif

	return (0);
}